

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O2

Address * cfd::ElementsAddressFactory::CreatePegOutAddress
                    (Address *__return_storage_ptr__,NetType mainchain_network,
                    NetType elements_network,string *descriptor_or_xpub,uint32_t bip32_counter,
                    AddressType address_type,Descriptor *base_descriptor)

{
  bool bVar1;
  AddressType AVar2;
  long lVar3;
  CfdException *pCVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string descriptor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string index_str;
  string extkey;
  DescriptorNode local_920;
  KeyData derived_key;
  DescriptorScriptReference ref;
  ExtPubkey pk;
  ExtPubkey check_key;
  Descriptor desc;
  
  if (2 < (int)mainchain_network) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ref,"Failed to mainchain network type. invalid value.",
               (allocator *)&derived_key);
    core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&ref);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (elements_network + ~kCustomChain < 0xfffffffd) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ref,"Failed to elements network type. invalid value.",
               (allocator *)&derived_key);
    core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&ref);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&descriptor,(string *)descriptor_or_xpub);
  lVar3 = std::__cxx11::string::find((char *)descriptor_or_xpub,0x51eac7);
  if (lVar3 == -1) {
    if (address_type == kP2shP2wpkhAddress) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &derived_key,"sh(wpkh(",descriptor_or_xpub);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &derived_key,"))");
    }
    else if (address_type == kP2wpkhAddress) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &derived_key,"wpkh(",descriptor_or_xpub);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &derived_key,")");
    }
    else {
      if (address_type != kP2pkhAddress) goto LAB_00354390;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &derived_key,"pkh(",descriptor_or_xpub);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &derived_key,")");
    }
    std::__cxx11::string::operator=((string *)&descriptor,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    std::__cxx11::string::~string((string *)&derived_key);
  }
LAB_00354390:
  core::Descriptor::Parse
            (&desc,&descriptor,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kMainnet);
  lVar3 = std::__cxx11::string::find((char *)&descriptor,0x5162ff);
  if (lVar3 != -1) {
    std::__cxx11::string::rfind((char *)&descriptor,0x51eac7);
    std::__cxx11::string::find((char *)&descriptor,0x5162ff);
    std::__cxx11::string::substr((ulong)&extkey,(ulong)&descriptor);
    core::ExtPubkey::ExtPubkey(&pk,&extkey);
    std::__cxx11::to_string(&index_str,bip32_counter);
    std::__cxx11::string::string((string *)&ref,(string *)&index_str);
    __l._M_len = 1;
    __l._M_array = (iterator)&ref;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&args,__l,(allocator_type *)&derived_key);
    std::__cxx11::string::~string((string *)&ref);
    core::Descriptor::GetKeyData(&derived_key,&desc,&args);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ref,"0/",
                   &index_str);
    core::ExtPubkey::DerivePubkey(&check_key,&pk,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    core::KeyData::GetPubkey((Pubkey *)&ref,&derived_key);
    core::Extkey::GetPubkey((Pubkey *)&local_920,&check_key.super_Extkey);
    bVar1 = core::Pubkey::Equals((Pubkey *)&ref,(Pubkey *)&local_920);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_920);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ref);
    if (!bVar1) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ref,"Invalid descriptor format. This path is not support on pegout.",
                 (allocator *)&local_920);
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&ref);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Descriptor::GetReference(&ref,&desc,&args);
    core::Extkey::ToString_abi_cxx11_(&local_920.name_,&pk.super_Extkey);
    std::__cxx11::string::operator=((string *)&descriptor,(string *)&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    AVar2 = core::DescriptorScriptReference::GetAddressType(&ref);
    if (AVar2 == kP2shP2wpkhAddress) {
      std::operator+(&local_998,"sh(wpkh(",&descriptor);
      std::operator+(&local_920.name_,&local_998,"))");
    }
    else if (AVar2 == kP2wpkhAddress) {
      std::operator+(&local_998,"wpkh(",&descriptor);
      std::operator+(&local_920.name_,&local_998,")");
    }
    else {
      if (AVar2 != kP2pkhAddress) {
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_920,
                   "Invalid descriptor. This descriptor type isn\'t support on pegout.",
                   (allocator *)&local_998);
        core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_920.name_);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::operator+(&local_998,"pkh(",&descriptor);
      std::operator+(&local_920.name_,&local_998,")");
    }
    std::__cxx11::string::operator=((string *)&descriptor,(string *)&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    std::__cxx11::string::~string((string *)&local_998);
    core::Descriptor::Parse
              ((Descriptor *)&local_920,&descriptor,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0,kMainnet);
    core::Descriptor::operator=(&desc,(Descriptor *)&local_920);
    core::DescriptorNode::~DescriptorNode(&local_920);
    core::DescriptorScriptReference::~DescriptorScriptReference(&ref);
    core::Extkey::~Extkey(&check_key.super_Extkey);
    core::KeyData::~KeyData(&derived_key);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
    std::__cxx11::string::~string((string *)&index_str);
    core::Extkey::~Extkey(&pk.super_Extkey);
    std::__cxx11::string::~string((string *)&extkey);
  }
  core::ConfidentialTransaction::GetPegoutAddressFromDescriptor
            (__return_storage_ptr__,&descriptor,bip32_counter,mainchain_network,elements_network);
  if (base_descriptor != (Descriptor *)0x0) {
    core::Descriptor::operator=(base_descriptor,&desc);
  }
  core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  std::__cxx11::string::~string((string *)&descriptor);
  return __return_storage_ptr__;
}

Assistant:

Address ElementsAddressFactory::CreatePegOutAddress(
    NetType mainchain_network, NetType elements_network,
    const std::string& descriptor_or_xpub, uint32_t bip32_counter,
    AddressType address_type, Descriptor* base_descriptor) {
  if (mainchain_network > NetType::kRegtest) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to mainchain network type. invalid value.");
  }
  if ((elements_network < NetType::kLiquidV1) ||
      (elements_network > NetType::kCustomChain)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to elements network type. invalid value.");
  }

  std::string descriptor = descriptor_or_xpub;
  if (descriptor_or_xpub.find("(") == std::string::npos) {
    if (address_type == AddressType::kP2pkhAddress) {
      descriptor = "pkh(" + descriptor_or_xpub + ")";
    } else if (address_type == AddressType::kP2shP2wpkhAddress) {
      descriptor = "sh(wpkh(" + descriptor_or_xpub + "))";
    } else if (address_type == AddressType::kP2wpkhAddress) {
      descriptor = "wpkh(" + descriptor_or_xpub + ")";
    }
  }

  auto desc = Descriptor::Parse(descriptor);
  if (descriptor.find("/") != std::string::npos) {
    auto start_pos = descriptor.rfind("(") + 1;
    auto end_pos = descriptor.find("/");
    std::string extkey = descriptor.substr(start_pos, end_pos - start_pos);
    ExtPubkey pk(extkey);
    auto index_str = std::to_string(bip32_counter);
    std::vector<std::string> args = {index_str};
    auto derived_key = desc.GetKeyData(args);
    auto check_key = pk.DerivePubkey("0/" + index_str);
    if (!derived_key.GetPubkey().Equals(check_key.GetPubkey())) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid descriptor format. This path is not support on pegout.");
    }

    auto ref = desc.GetReference(&args);
    descriptor = pk.ToString();
    auto addr_type = ref.GetAddressType();
    if (addr_type == AddressType::kP2pkhAddress) {
      descriptor = "pkh(" + descriptor + ")";
    } else if (addr_type == AddressType::kP2shP2wpkhAddress) {
      descriptor = "sh(wpkh(" + descriptor + "))";
    } else if (addr_type == AddressType::kP2wpkhAddress) {
      descriptor = "wpkh(" + descriptor + ")";
    } else {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid descriptor. This descriptor type isn't support on pegout.");
    }
    desc = Descriptor::Parse(descriptor);
  }

  auto addr = ConfidentialTransaction::GetPegoutAddressFromDescriptor(
      descriptor, bip32_counter, mainchain_network, elements_network);
  if (base_descriptor != nullptr) *base_descriptor = desc;
  return addr;
}